

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

void __thiscall QWizard::setButton(QWizard *this,WizardButton which,QAbstractButton *button)

{
  QWizardPrivate *this_00;
  QWidget *widget;
  int *piVar1;
  QAbstractButton *oldButton;
  long in_FS_OFFSET;
  QString local_58;
  WizardButton local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((uint)which < 9) {
    this_00 = *(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
    widget = *(QWidget **)((long)&this_00->field_20 + (ulong)(uint)which * 8);
    if (widget != &button->super_QWidget) {
      if (widget != (QWidget *)0x0) {
        QLayout::removeWidget((QLayout *)this_00->buttonLayout,widget);
        (**(code **)(*(long *)widget + 0x20))(widget);
      }
      *(QAbstractButton **)((long)&this_00->field_20 + (ulong)(uint)which * 8) = button;
      if (button == (QAbstractButton *)0x0) {
        local_58.d.d._0_4_ = which;
        QMap<int,_QString>::remove(&this_00->buttonCustomTexts,(char *)&local_58);
        QWizardPrivate::ensureButton(this_00,which);
      }
      else {
        QWidget::setParent(&button->super_QWidget,&this_00->antiFlickerWidget->super_QWidget);
        local_3c = which;
        QAbstractButton::text(&local_58,button);
        QMap<int,_QString>::insert(&this_00->buttonCustomTexts,&local_3c,&local_58);
        piVar1 = (int *)CONCAT44(local_58.d.d._4_4_,(WizardButton)local_58.d.d);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_58.d.d._4_4_,(WizardButton)local_58.d.d),2,0x10)
            ;
          }
        }
        QWizardPrivate::connectButton(this_00,which);
      }
      QWizardPrivate::updateButtonLayout(this_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizard::setButton(WizardButton which, QAbstractButton *button)
{
    Q_D(QWizard);

    if (uint(which) >= NButtons || d->btns[which] == button)
        return;

    if (QAbstractButton *oldButton = d->btns[which]) {
        d->buttonLayout->removeWidget(oldButton);
        delete oldButton;
    }

    d->btns[which] = button;
    if (button) {
        button->setParent(d->antiFlickerWidget);
        d->buttonCustomTexts.insert(which, button->text());
        d->connectButton(which);
    } else {
        d->buttonCustomTexts.remove(which); // ### what about page-specific texts set for 'which'
        d->ensureButton(which);             // (QWizardPage::setButtonText())? Clear them as well?
    }

    d->updateButtonLayout();
}